

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::PreserveBackBufferCase::iterate(PreserveBackBufferCase *this)

{
  Functions *gl;
  ResultCollector *this_00;
  TestLog *this_01;
  bool condition;
  deUint32 dVar1;
  GLenum GVar2;
  Library *egl;
  EGLSurface pvVar3;
  Surface *pSVar4;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int __fd;
  allocator<char> local_2be;
  allocator<char> local_2bd;
  allocator<char> local_2bc;
  allocator<char> local_2bb;
  allocator<char> local_2ba;
  allocator<char> local_2b9;
  IVec2 oldEglSize;
  IVec2 newEglSize;
  Surface newSurface;
  Surface oldSurface;
  ScopedCurrentContext currentCtx;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  Vector<int,_2> local_1a8;
  Vector<int,_2> local_1a0;
  Vector<int,_2> local_198;
  Vector<int,_2> local_190;
  LogImageSet local_188;
  LogImage local_148;
  LogImage local_b8;
  
  egl = EglTestContext::getLibrary((this->super_ResizeTest).super_TestCase.m_eglTestCtx);
  pvVar3 = ((this->super_ResizeTest).m_surface.
            super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data.
           ptr)->m_surface;
  eglu::ScopedCurrentContext::ScopedCurrentContext
            (&currentCtx,egl,(this->super_ResizeTest).m_display,pvVar3,pvVar3,
             ((this->super_ResizeTest).m_context.
              super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>.m_data
             .ptr)->m_context);
  (*egl->_vptr_Library[0x30])
            (egl,(this->super_ResizeTest).m_display,
             ((this->super_ResizeTest).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data
             .ptr)->m_surface,0x3093,0x3094);
  dVar1 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar1,
                   "surfaceAttrib(m_display, **m_surface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                   ,0x186);
  GVar2 = (*(this->super_ResizeTest).m_gl.getError)();
  glu::checkError(GVar2,"GL state erroneous upon initialization!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                  ,0x188);
  eglu::getSurfaceSize
            ((eglu *)&oldEglSize,egl,(this->super_ResizeTest).m_display,
             ((this->super_ResizeTest).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data
             .ptr)->m_surface);
  gl = &(this->super_ResizeTest).m_gl;
  tcu::Vector<int,_2>::Vector(&local_190,&oldEglSize);
  initSurface(gl,&local_190);
  (*(this->super_ResizeTest).m_gl.finish)();
  GVar2 = (*(this->super_ResizeTest).m_gl.getError)();
  glu::checkError(GVar2,"glFinish() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                  ,399);
  tcu::Vector<int,_2>::Vector(&local_198,&oldEglSize);
  readSurface(&oldSurface,gl,&local_198);
  (*egl->_vptr_Library[0x31])
            (egl,(this->super_ResizeTest).m_display,
             ((this->super_ResizeTest).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data
             .ptr)->m_surface);
  tcu::Vector<int,_2>::Vector(&local_1a0,&(this->super_ResizeTest).m_newSize);
  ResizeTest::resize(&this->super_ResizeTest,&local_1a0);
  (*egl->_vptr_Library[0x31])
            (egl,(this->super_ResizeTest).m_display,
             ((this->super_ResizeTest).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data
             .ptr)->m_surface);
  dVar1 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar1,"eglSwapBuffers()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                   ,0x197);
  pvVar3 = ((this->super_ResizeTest).m_surface.
            super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data.
           ptr)->m_surface;
  eglu::getSurfaceSize((eglu *)&newEglSize,egl,(this->super_ResizeTest).m_display,pvVar3);
  tcu::Vector<int,_2>::Vector(&local_1a8,&newEglSize);
  readSurface(&newSurface,gl,&local_1a8);
  this_01 = (this->super_ResizeTest).m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"Corner comparison",&local_2b9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"Comparing old and new surfaces at all corners",&local_2ba);
  tcu::LogImageSet::LogImageSet(&local_188,&local_1c8,&local_1e8);
  __fd = (int)this_01;
  tcu::LogImageSet::write(&local_188,__fd,__buf,(size_t)pvVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"Before resizing",&local_2bb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"Before resizing",&local_2bc);
  pSVar4 = &oldSurface;
  tcu::LogImage::LogImage(&local_148,&local_208,&local_228,pSVar4,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_148,__fd,__buf_00,(size_t)pSVar4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"After resizing",&local_2bd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"After resizing",&local_2be);
  pSVar4 = &newSurface;
  tcu::LogImage::LogImage(&local_b8,&local_248,&local_268,pSVar4,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_b8,__fd,__buf_01,(size_t)pSVar4);
  tcu::TestLog::endImageSet(this_01);
  tcu::LogImage::~LogImage(&local_b8);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  tcu::LogImage::~LogImage(&local_148);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  tcu::LogImageSet::~LogImageSet(&local_188);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  condition = compareCorners(&oldSurface,&newSurface);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,
             "Resizing the native window changed the contents of the EGL surface",
             (allocator<char> *)&local_b8);
  this_00 = &(this->super_ResizeTest).m_status;
  tcu::ResultCollector::checkResult
            (this_00,condition,QP_TEST_RESULT_QUALITY_WARNING,&local_148.m_name);
  std::__cxx11::string::~string((string *)&local_148);
  tcu::Surface::~Surface(&newSurface);
  tcu::Surface::~Surface(&oldSurface);
  tcu::ResultCollector::setTestContextResult
            (this_00,(this->super_ResizeTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx
            );
  eglu::ScopedCurrentContext::~ScopedCurrentContext(&currentCtx);
  return STOP;
}

Assistant:

IterateResult PreserveBackBufferCase::iterate (void)
{
	const Library&			egl			= m_eglTestCtx.getLibrary();
	ScopedCurrentContext	currentCtx	(egl, m_display, **m_surface, **m_surface, **m_context);

	EGLU_CHECK_CALL(egl, surfaceAttrib(m_display, **m_surface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED));

	GLU_EXPECT_NO_ERROR(m_gl.getError(), "GL state erroneous upon initialization!");

	{
		const IVec2 oldEglSize = eglu::getSurfaceSize(egl, m_display, **m_surface);
		initSurface(m_gl, oldEglSize);

		m_gl.finish();
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glFinish() failed");

		{
			const Surface oldSurface = readSurface(m_gl, oldEglSize);

			egl.swapBuffers(m_display, **m_surface);
			this->resize(m_newSize);
			egl.swapBuffers(m_display, **m_surface);
			EGLU_CHECK_MSG(egl, "eglSwapBuffers()");

			{
				const IVec2		newEglSize	= eglu::getSurfaceSize(egl, m_display, **m_surface);
				const Surface	newSurface	= readSurface(m_gl, newEglSize);

				m_log << TestLog::ImageSet("Corner comparison",
										   "Comparing old and new surfaces at all corners")
					  << TestLog::Image("Before resizing", "Before resizing", oldSurface)
					  << TestLog::Image("After resizing", "After resizing", newSurface)
					  << TestLog::EndImageSet;

				m_status.checkResult(compareCorners(oldSurface, newSurface),
									 QP_TEST_RESULT_QUALITY_WARNING,
									 "Resizing the native window changed the contents of "
									 "the EGL surface");
			}
		}
	}

	m_status.setTestContextResult(m_testCtx);
	return STOP;
}